

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serfloat_tests.cpp
# Opt level: O0

void __thiscall serfloat_tests::double_serfloat_tests::test_method(double_serfloat_tests *this)

{
  bool bVar1;
  const_iterator piVar2;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffde58;
  lazy_ostream *in_stack_ffffffffffffde60;
  char *in_stack_ffffffffffffde68;
  int in_stack_ffffffffffffde74;
  RandomMixin<FastRandomContext> *in_stack_ffffffffffffde78;
  const_string *in_stack_ffffffffffffde80;
  size_t in_stack_ffffffffffffde88;
  double line_num;
  const_string *in_stack_ffffffffffffde90;
  const_string *file;
  unit_test_log_t *in_stack_ffffffffffffde98;
  unit_test_log_t *this_00;
  double in_stack_ffffffffffffe0c8;
  double f_00;
  int v_pos;
  const_iterator __end3;
  const_iterator __begin3;
  initializer_list<int> *__range3;
  int x_pos;
  int x;
  int j;
  double_serfloat_tests *this_local;
  double f;
  uint64_t v;
  undefined1 local_15f0 [8];
  const_string *local_15e8;
  undefined1 local_15e0 [16];
  undefined1 local_15d0 [32];
  unit_test_log_t local_15b0 [2];
  const_string local_15a0;
  lazy_ostream local_1590;
  undefined1 local_1580 [16];
  undefined1 local_1570 [64];
  lazy_ostream local_1530;
  undefined1 local_1520 [16];
  undefined1 local_1510 [64];
  lazy_ostream local_14d0;
  undefined1 local_14c0 [16];
  undefined1 local_14b0 [64];
  lazy_ostream local_1470;
  undefined1 local_1460 [16];
  undefined1 local_1450 [68];
  lazy_ostream local_140c;
  undefined1 local_13f0 [64];
  lazy_ostream local_13b0;
  undefined1 local_13a0 [16];
  undefined1 local_1390 [64];
  lazy_ostream local_1350;
  undefined1 local_1340 [16];
  undefined1 local_1330 [64];
  lazy_ostream local_12f0;
  undefined1 local_12e0 [16];
  undefined1 local_12d0 [64];
  lazy_ostream local_1290;
  undefined1 local_1280 [16];
  undefined1 local_1270 [64];
  lazy_ostream local_1230;
  undefined1 local_1220 [16];
  undefined1 local_1210 [64];
  lazy_ostream local_11d0;
  undefined1 local_11c0 [16];
  undefined1 local_11b0 [64];
  lazy_ostream local_1170;
  undefined1 local_1160 [16];
  undefined1 local_1150 [64];
  lazy_ostream local_1110;
  undefined1 local_1100 [16];
  undefined1 local_10f0 [64];
  lazy_ostream local_10b0;
  undefined1 local_10a0 [16];
  undefined1 local_1090 [64];
  lazy_ostream local_1050;
  undefined1 local_1040 [16];
  undefined1 local_1030 [48];
  undefined8 local_1000;
  lazy_ostream local_ff0;
  undefined1 local_fe0 [16];
  undefined1 local_fd0 [64];
  lazy_ostream local_f90;
  undefined1 local_f80 [16];
  undefined1 local_f70 [64];
  lazy_ostream local_f30;
  undefined1 local_f20 [16];
  undefined1 local_f10 [64];
  lazy_ostream local_ed0;
  undefined1 local_ec0 [16];
  undefined1 local_eb0 [64];
  lazy_ostream local_e70;
  undefined1 local_e60 [16];
  undefined1 local_e50 [64];
  lazy_ostream local_e10;
  undefined1 local_e00 [16];
  undefined1 local_df0 [64];
  lazy_ostream local_db0;
  undefined1 local_da0 [16];
  undefined1 local_d90 [64];
  lazy_ostream local_d50;
  undefined1 local_d40 [16];
  undefined1 local_d30 [64];
  lazy_ostream local_cf0;
  undefined1 local_ce0 [16];
  undefined1 local_cd0 [64];
  lazy_ostream local_c90;
  undefined1 local_c80 [16];
  undefined1 local_c70 [64];
  lazy_ostream local_c30;
  undefined1 local_c20 [16];
  undefined1 local_c10 [64];
  lazy_ostream local_bd0;
  undefined1 local_bc0 [16];
  undefined1 local_bb0 [64];
  lazy_ostream local_b70;
  undefined1 local_b60 [16];
  undefined1 local_b50 [64];
  lazy_ostream local_b10;
  undefined1 local_b00 [16];
  undefined1 local_af0 [64];
  lazy_ostream local_ab0;
  undefined1 local_aa0 [16];
  undefined1 local_a90 [64];
  lazy_ostream local_a50;
  undefined1 local_a40 [16];
  undefined1 local_a30 [64];
  lazy_ostream local_9f0;
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [64];
  lazy_ostream local_990;
  undefined1 local_980 [16];
  undefined1 local_970 [64];
  lazy_ostream local_930;
  undefined1 local_920 [16];
  undefined1 local_910 [64];
  lazy_ostream local_8d0;
  undefined1 local_8c0 [16];
  undefined1 local_8b0 [64];
  lazy_ostream local_870;
  undefined1 local_860 [16];
  undefined1 local_850 [64];
  lazy_ostream local_810;
  undefined1 local_800 [16];
  undefined1 local_7f0 [64];
  lazy_ostream local_7b0;
  undefined1 local_7a0 [16];
  undefined1 local_790 [64];
  lazy_ostream local_750;
  undefined1 local_740 [16];
  undefined1 local_730 [64];
  lazy_ostream local_6f0;
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [64];
  lazy_ostream local_690;
  undefined1 local_680 [16];
  undefined1 local_670 [64];
  lazy_ostream local_630;
  undefined1 local_620 [16];
  undefined1 local_610 [64];
  lazy_ostream local_5d0;
  undefined1 local_5c0 [16];
  undefined1 local_5b0 [64];
  lazy_ostream local_570;
  undefined1 local_560 [16];
  undefined1 local_550 [64];
  lazy_ostream local_510;
  undefined1 local_500 [16];
  undefined1 local_4f0 [64];
  lazy_ostream local_4b0;
  undefined1 local_4a0 [16];
  undefined1 local_490 [64];
  lazy_ostream local_450;
  undefined1 local_440 [16];
  undefined1 local_430 [64];
  lazy_ostream local_3f0;
  undefined1 local_3e0 [16];
  undefined1 local_3d0 [64];
  lazy_ostream local_390;
  undefined1 local_380 [16];
  undefined1 local_370 [64];
  lazy_ostream local_330;
  undefined1 local_320 [16];
  undefined1 local_310 [64];
  lazy_ostream local_2d0;
  undefined1 local_2c0 [16];
  undefined1 local_2b0 [64];
  lazy_ostream local_270;
  undefined1 local_260 [16];
  undefined1 local_250 [64];
  lazy_ostream local_210;
  undefined1 local_200 [16];
  undefined1 local_1f0 [64];
  lazy_ostream local_1b0;
  undefined1 local_1a0 [16];
  undefined1 local_190 [64];
  lazy_ostream local_150;
  undefined1 local_140 [16];
  undefined1 local_130 [64];
  lazy_ostream local_f0;
  undefined1 local_e0 [16];
  undefined1 local_d0 [68];
  lazy_ostream local_8c;
  undefined1 local_70 [68];
  undefined1 local_2c [36];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_8c._4_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_8c._vptr_lazy_ostream._0_4_ = 0;
    in_stack_ffffffffffffde68 = "0U";
    in_stack_ffffffffffffde60 = &local_8c;
    in_stack_ffffffffffffde58 = "TestDouble(0.0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_70,&local_8c.field_0xc,0x29,1,2,
               (undefined1 *)((long)&local_8c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_f0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_f0._vptr_lazy_ostream = (_func_int **)0x8000000000000000;
    in_stack_ffffffffffffde68 = "0x8000000000000000";
    in_stack_ffffffffffffde60 = &local_f0;
    in_stack_ffffffffffffde58 = "TestDouble(-0.0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_d0,local_e0,0x2a,1,2,&local_f0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::infinity();
    local_150._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_150._vptr_lazy_ostream = (_func_int **)0x7ff0000000000000;
    in_stack_ffffffffffffde68 = "0x7ff0000000000000U";
    in_stack_ffffffffffffde60 = &local_150;
    in_stack_ffffffffffffde58 = "TestDouble(std::numeric_limits<double>::infinity())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_130,local_140,0x2b,1,2,&local_150.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::infinity();
    local_1b0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_1b0._vptr_lazy_ostream = (_func_int **)0xfff0000000000000;
    in_stack_ffffffffffffde68 = "0xfff0000000000000";
    in_stack_ffffffffffffde60 = &local_1b0;
    in_stack_ffffffffffffde58 = "TestDouble(-std::numeric_limits<double>::infinity())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_190,local_1a0,0x2c,1,2,&local_1b0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_210._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_210._vptr_lazy_ostream = (_func_int **)0x3fe0000000000000;
    in_stack_ffffffffffffde68 = "0x3fe0000000000000ULL";
    in_stack_ffffffffffffde60 = &local_210;
    in_stack_ffffffffffffde58 = "TestDouble(0.5)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_1f0,local_200,0x2d,1,2,&local_210.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_270._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_270._vptr_lazy_ostream = (_func_int **)0x3ff0000000000000;
    in_stack_ffffffffffffde68 = "0x3ff0000000000000ULL";
    in_stack_ffffffffffffde60 = &local_270;
    in_stack_ffffffffffffde58 = "TestDouble(1.0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_250,local_260,0x2e,1,2,&local_270.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_2d0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_2d0._vptr_lazy_ostream = (_func_int **)0x4000000000000000;
    in_stack_ffffffffffffde68 = "0x4000000000000000ULL";
    in_stack_ffffffffffffde60 = &local_2d0;
    in_stack_ffffffffffffde58 = "TestDouble(2.0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_2b0,local_2c0,0x2f,1,2,&local_2d0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_330._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_330._vptr_lazy_ostream = (_func_int **)0x4010000000000000;
    in_stack_ffffffffffffde68 = "0x4010000000000000ULL";
    in_stack_ffffffffffffde60 = &local_330;
    in_stack_ffffffffffffde58 = "TestDouble(4.0)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_310,local_320,0x30,1,2,&local_330.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_390._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_390._vptr_lazy_ostream = (_func_int **)0x4088888880000000;
    in_stack_ffffffffffffde68 = "0x4088888880000000ULL";
    in_stack_ffffffffffffde60 = &local_390;
    in_stack_ffffffffffffde58 = "TestDouble(785.066650390625)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long_long>
              (local_370,local_380,0x31,1,2,&local_390.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_3f0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_3f0._vptr_lazy_ostream = (_func_int **)0x400dcb60e0031440;
    in_stack_ffffffffffffde68 = "0x400dcb60e0031440";
    in_stack_ffffffffffffde60 = &local_3f0;
    in_stack_ffffffffffffde58 = "TestDouble(3.7243058682384174)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_3d0,local_3e0,0x32,1,2,&local_3f0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_450._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_450._vptr_lazy_ostream = (_func_int **)0x4056e901536d447a;
    in_stack_ffffffffffffde68 = "0x4056e901536d447a";
    in_stack_ffffffffffffde60 = &local_450;
    in_stack_ffffffffffffde58 = "TestDouble(91.64070592566159)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_430,local_440,0x33,1,2,&local_450.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_4b0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_4b0._vptr_lazy_ostream = (_func_int **)0xc058a860489c007a;
    in_stack_ffffffffffffde68 = "0xc058a860489c007a";
    in_stack_ffffffffffffde60 = &local_4b0;
    in_stack_ffffffffffffde58 = "TestDouble(-98.63087668642575)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_490,local_4a0,0x34,1,2,&local_4b0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_510._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_510._vptr_lazy_ostream = (_func_int **)0x4013a28c268b2b70;
    in_stack_ffffffffffffde68 = "0x4013a28c268b2b70";
    in_stack_ffffffffffffde60 = &local_510;
    in_stack_ffffffffffffde58 = "TestDouble(4.908737756962054)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_4f0,local_500,0x35,1,2,&local_510.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_570._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_570._vptr_lazy_ostream = (_func_int **)0x40537b2ed3547804;
    in_stack_ffffffffffffde68 = "0x40537b2ed3547804";
    in_stack_ffffffffffffde60 = &local_570;
    in_stack_ffffffffffffde58 = "TestDouble(77.9247330021754)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_550,local_560,0x36,1,2,&local_570.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_5d0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_5d0._vptr_lazy_ostream = (_func_int **)0x40441fa873c43dfc;
    in_stack_ffffffffffffde68 = "0x40441fa873c43dfc";
    in_stack_ffffffffffffde60 = &local_5d0;
    in_stack_ffffffffffffde58 = "TestDouble(40.24732825357566)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_5b0,local_5c0,0x37,1,2,&local_5d0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_630._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_630._vptr_lazy_ostream = (_func_int **)0x4051d936938f27b6;
    in_stack_ffffffffffffde68 = "0x4051d936938f27b6";
    in_stack_ffffffffffffde60 = &local_630;
    in_stack_ffffffffffffde58 = "TestDouble(71.39395607929222)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_610,local_620,0x38,1,2,&local_630.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_690._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_690._vptr_lazy_ostream = (_func_int **)0x404d668766a2bd70;
    in_stack_ffffffffffffde68 = "0x404d668766a2bd70";
    in_stack_ffffffffffffde60 = &local_690;
    in_stack_ffffffffffffde58 = "TestDouble(58.80100710817612)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_670,local_680,0x39,1,2,&local_690.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_6f0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_6f0._vptr_lazy_ostream = (_func_int **)0xc03e1b4dee1e01b8;
    in_stack_ffffffffffffde68 = "0xc03e1b4dee1e01b8";
    in_stack_ffffffffffffde60 = &local_6f0;
    in_stack_ffffffffffffde58 = "TestDouble(-30.10665786964975)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_6d0,local_6e0,0x3a,1,2,&local_6f0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_750._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_750._vptr_lazy_ostream = (_func_int **)0x404e137f0f969814;
    in_stack_ffffffffffffde68 = "0x404e137f0f969814";
    in_stack_ffffffffffffde60 = &local_750;
    in_stack_ffffffffffffde58 = "TestDouble(60.15231509068704)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_730,local_740,0x3b,1,2,&local_750.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_7b0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_7b0._vptr_lazy_ostream = (_func_int **)0xc04814494e445bc6;
    in_stack_ffffffffffffde68 = "0xc04814494e445bc6";
    in_stack_ffffffffffffde60 = &local_7b0;
    in_stack_ffffffffffffde58 = "TestDouble(-48.15848711335961)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_790,local_7a0,0x3c,1,2,&local_7b0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_810._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_810._vptr_lazy_ostream = (_func_int **)0x403aaf3b755169b0;
    in_stack_ffffffffffffde68 = "0x403aaf3b755169b0";
    in_stack_ffffffffffffde60 = &local_810;
    in_stack_ffffffffffffde58 = "TestDouble(26.68450101125353)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_7f0,local_800,0x3d,1,2,&local_810.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_870._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_870._vptr_lazy_ostream = (_func_int **)0xc0506e2046378ede;
    in_stack_ffffffffffffde68 = "0xc0506e2046378ede";
    in_stack_ffffffffffffde60 = &local_870;
    in_stack_ffffffffffffde58 = "TestDouble(-65.72071986604303)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_850,local_860,0x3e,1,2,&local_870.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_8d0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_8d0._vptr_lazy_ostream = (_func_int **)0x4031f4ac92b0a388;
    in_stack_ffffffffffffde68 = "0x4031f4ac92b0a388";
    in_stack_ffffffffffffde60 = &local_8d0;
    in_stack_ffffffffffffde58 = "TestDouble(17.95575825512381)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_8b0,local_8c0,0x3f,1,2,&local_8d0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_930._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_930._vptr_lazy_ostream = (_func_int **)0xc041a2c7ad17a42a;
    in_stack_ffffffffffffde68 = "0xc041a2c7ad17a42a";
    in_stack_ffffffffffffde60 = &local_930;
    in_stack_ffffffffffffde58 = "TestDouble(-35.27171863226279)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_910,local_920,0x40,1,2,&local_930.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_990._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_990._vptr_lazy_ostream = (_func_int **)0xc0212d1bdffef538;
    in_stack_ffffffffffffde68 = "0xc0212d1bdffef538";
    in_stack_ffffffffffffde60 = &local_990;
    in_stack_ffffffffffffde58 = "TestDouble(-8.58810329425124)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_970,local_980,0x41,1,2,&local_990.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_9f0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_9f0._vptr_lazy_ostream = (_func_int **)0x405620e43c83b1c8;
    in_stack_ffffffffffffde68 = "0x405620e43c83b1c8";
    in_stack_ffffffffffffde60 = &local_9f0;
    in_stack_ffffffffffffde58 = "TestDouble(88.51393044338977)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_9d0,local_9e0,0x42,1,2,&local_9f0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_a50._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_a50._vptr_lazy_ostream = (_func_int **)0x4048093f77466ffc;
    in_stack_ffffffffffffde68 = "0x4048093f77466ffc";
    in_stack_ffffffffffffde60 = &local_a50;
    in_stack_ffffffffffffde58 = "TestDouble(48.07224932612732)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_a30,local_a40,0x43,1,2,&local_a50.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_ab0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_ab0._vptr_lazy_ostream = (_func_int **)0x586f4daeb2459b9f;
    in_stack_ffffffffffffde68 = "0x586f4daeb2459b9f";
    in_stack_ffffffffffffde60 = &local_ab0;
    in_stack_ffffffffffffde58 = "TestDouble(9.867348871395659e+117)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_a90,local_aa0,0x44,1,2,&local_ab0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_b10._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_b10._vptr_lazy_ostream = (_func_int **)0xeabe3bbc484bd458;
    in_stack_ffffffffffffde68 = "0xeabe3bbc484bd458";
    in_stack_ffffffffffffde60 = &local_b10;
    in_stack_ffffffffffffde58 = "TestDouble(-1.5166424385129721e+206)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_af0,local_b00,0x45,1,2,&local_b10.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_b70._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_b70._vptr_lazy_ostream = (_func_int **)0x8707c76eee012429;
    in_stack_ffffffffffffde68 = "0x8707c76eee012429";
    in_stack_ffffffffffffde60 = &local_b70;
    in_stack_ffffffffffffde58 = "TestDouble(-8.585156555624594e-275)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_b50,local_b60,0x46,1,2,&local_b70.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_bd0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_bd0._vptr_lazy_ostream = (_func_int **)0x5777b2184458f4ee;
    in_stack_ffffffffffffde68 = "0x5777b2184458f4ee";
    in_stack_ffffffffffffde60 = &local_bd0;
    in_stack_ffffffffffffde58 = "TestDouble(2.2794371091628822e+113)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_bb0,local_bc0,0x47,1,2,&local_bd0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_c30._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_c30._vptr_lazy_ostream = (_func_int **)0xe1c91893d3488bb0;
    in_stack_ffffffffffffde68 = "0xe1c91893d3488bb0";
    in_stack_ffffffffffffde60 = &local_c30;
    in_stack_ffffffffffffde58 = "TestDouble(-1.1290476594131867e+163)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_c10,local_c20,0x48,1,2,&local_c30.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_c90._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_c90._vptr_lazy_ostream = (_func_int **)0xd0ff76e5f2620a3;
    in_stack_ffffffffffffde68 = "0x0d0ff76e5f2620a3";
    in_stack_ffffffffffffde60 = &local_c90;
    in_stack_ffffffffffffde58 = "TestDouble(9.143848423979275e-246)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_c70,local_c80,0x49,1,2,&local_c90.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_cf0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_cf0._vptr_lazy_ostream = (_func_int **)0xd0d7ec7e754b394a;
    in_stack_ffffffffffffde68 = "0xd0d7ec7e754b394a";
    in_stack_ffffffffffffde60 = &local_cf0;
    in_stack_ffffffffffffde58 = "TestDouble(-2.8366718125941117e+81)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_cd0,local_ce0,0x4a,1,2,&local_cf0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_d50._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_d50._vptr_lazy_ostream = (_func_int **)0xef80d32f8ec55342;
    in_stack_ffffffffffffde68 = "0xef80d32f8ec55342";
    in_stack_ffffffffffffde60 = &local_d50;
    in_stack_ffffffffffffde58 = "TestDouble(-1.2754409481684012e+229)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_d30,local_d40,0x4b,1,2,&local_d50.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_db0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_db0._vptr_lazy_ostream = (_func_int **)0x197a1be7c8209b6a;
    in_stack_ffffffffffffde68 = "0x197a1be7c8209b6a";
    in_stack_ffffffffffffde60 = &local_db0;
    in_stack_ffffffffffffde58 = "TestDouble(6.000577060053642e-186)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_d90,local_da0,0x4c,1,2,&local_db0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_e10._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_e10._vptr_lazy_ostream = (_func_int **)0x14c94f8689cb0a5;
    in_stack_ffffffffffffde68 = "0x014c94f8689cb0a5";
    in_stack_ffffffffffffde60 = &local_e10;
    in_stack_ffffffffffffde58 = "TestDouble(2.0839423284378986e-302)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_df0,local_e00,0x4d,1,2,&local_e10.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_e70._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_e70._vptr_lazy_ostream = (_func_int **)0xf5bd99271d04bb35;
    in_stack_ffffffffffffde68 = "0xf5bd99271d04bb35";
    in_stack_ffffffffffffde60 = &local_e70;
    in_stack_ffffffffffffde58 = "TestDouble(-1.422140051483753e+259)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_e50,local_e60,0x4e,1,2,&local_e70.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_ed0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_ed0._vptr_lazy_ostream = (_func_int **)0xc97db0cdb72d1046;
    in_stack_ffffffffffffde68 = "0xc97db0cdb72d1046";
    in_stack_ffffffffffffde60 = &local_ed0;
    in_stack_ffffffffffffde58 = "TestDouble(-1.0593973991188853e+46)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_eb0,local_ec0,0x4f,1,2,&local_ed0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_f30._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_f30._vptr_lazy_ostream = (_func_int **)0x67779b36366c993b;
    in_stack_ffffffffffffde68 = "0x67779b36366c993b";
    in_stack_ffffffffffffde60 = &local_f30;
    in_stack_ffffffffffffde58 = "TestDouble(2.62945125875249e+190)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_f10,local_f20,0x50,1,2,&local_f30.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_f90._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_f90._vptr_lazy_ostream = (_func_int **)0xd7e7b7b45908e23b;
    in_stack_ffffffffffffde68 = "0xd7e7b7b45908e23b";
    in_stack_ffffffffffffde60 = &local_f90;
    in_stack_ffffffffffffde58 = "TestDouble(-2.920377657275094e+115)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_f70,local_f80,0x51,1,2,&local_f90.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_ff0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_ff0._vptr_lazy_ostream = (_func_int **)0x27a3c031cc428bcc;
    in_stack_ffffffffffffde68 = "0x27a3c031cc428bcc";
    in_stack_ffffffffffffde60 = &local_ff0;
    in_stack_ffffffffffffde58 = "TestDouble(9.790289014855851e-118)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_fd0,local_fe0,0x52,1,2,&local_ff0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_1050._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_1050._vptr_lazy_ostream = (_func_int **)0xa866ccf0b753705a;
    in_stack_ffffffffffffde68 = "0xa866ccf0b753705a";
    in_stack_ffffffffffffde60 = &local_1050;
    in_stack_ffffffffffffde58 = "TestDouble(-4.629317182034961e-114)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1030,local_1040,0x53,1,2,&local_1050.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_10b0._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_10b0._vptr_lazy_ostream = (_func_int **)0xf9e8ed383ffc3e25;
    in_stack_ffffffffffffde68 = "0xf9e8ed383ffc3e25";
    in_stack_ffffffffffffde60 = &local_10b0;
    in_stack_ffffffffffffde58 = "TestDouble(-1.7674605603846528e+279)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1090,local_10a0,0x54,1,2,&local_10b0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_1110._8_8_ = anon_unknown_4::TestDouble(in_stack_ffffffffffffe0c8);
    local_1110._vptr_lazy_ostream = (_func_int **)0x58ef5cd55f0ec997;
    in_stack_ffffffffffffde68 = "0x58ef5cd55f0ec997";
    in_stack_ffffffffffffde60 = &local_1110;
    in_stack_ffffffffffffde58 = "TestDouble(2.5308171727712605e+120)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_10f0,local_1100,0x55,1,2,&local_1110.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    f_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    local_1170._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_1170._vptr_lazy_ostream = (_func_int **)0xcb25eea1b9350fa0;
    in_stack_ffffffffffffde68 = "0xcb25eea1b9350fa0";
    in_stack_ffffffffffffde60 = &local_1170;
    in_stack_ffffffffffffde58 = "TestDouble(-1.05034156412799e+54)";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1150,local_1160,0x56,1,2,&local_1170.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::min();
    local_11d0._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_11d0._vptr_lazy_ostream = (_func_int **)0x10000000000000;
    in_stack_ffffffffffffde68 = "0x10000000000000";
    in_stack_ffffffffffffde60 = &local_11d0;
    in_stack_ffffffffffffde58 = "TestDouble(std::numeric_limits<double>::min())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_11b0,local_11c0,0x59,1,2,&local_11d0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::min();
    local_1230._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_1230._vptr_lazy_ostream = (_func_int **)0x8010000000000000;
    in_stack_ffffffffffffde68 = "0x8010000000000000";
    in_stack_ffffffffffffde60 = &local_1230;
    in_stack_ffffffffffffde58 = "TestDouble(-std::numeric_limits<double>::min())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1210,local_1220,0x5a,1,2,&local_1230.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::max();
    local_1290._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_1290._vptr_lazy_ostream = (_func_int **)0x7fefffffffffffff;
    in_stack_ffffffffffffde68 = "0x7fefffffffffffff";
    in_stack_ffffffffffffde60 = &local_1290;
    in_stack_ffffffffffffde58 = "TestDouble(std::numeric_limits<double>::max())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_1270,local_1280,0x5b,1,2,&local_1290.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::max();
    local_12f0._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_12f0._vptr_lazy_ostream = (_func_int **)0xffefffffffffffff;
    in_stack_ffffffffffffde68 = "0xffefffffffffffff";
    in_stack_ffffffffffffde60 = &local_12f0;
    in_stack_ffffffffffffde58 = "TestDouble(-std::numeric_limits<double>::max())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_12d0,local_12e0,0x5c,1,2,&local_12f0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::lowest();
    local_1350._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_1350._vptr_lazy_ostream = (_func_int **)0xffefffffffffffff;
    in_stack_ffffffffffffde68 = "0xffefffffffffffff";
    in_stack_ffffffffffffde60 = &local_1350;
    in_stack_ffffffffffffde58 = "TestDouble(std::numeric_limits<double>::lowest())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1330,local_1340,0x5d,1,2,&local_1350.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::lowest();
    local_13b0._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_13b0._vptr_lazy_ostream = (_func_int **)0x7fefffffffffffff;
    in_stack_ffffffffffffde68 = "0x7fefffffffffffff";
    in_stack_ffffffffffffde60 = &local_13b0;
    in_stack_ffffffffffffde58 = "TestDouble(-std::numeric_limits<double>::lowest())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_1390,local_13a0,0x5e,1,2,&local_13b0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::denorm_min();
    local_140c._4_8_ = anon_unknown_4::TestDouble(f_00);
    local_140c._vptr_lazy_ostream._0_4_ = 1;
    in_stack_ffffffffffffde68 = "0x1";
    in_stack_ffffffffffffde60 = &local_140c;
    in_stack_ffffffffffffde58 = "TestDouble(std::numeric_limits<double>::denorm_min())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,int>
              (local_13f0,&local_140c.field_0xc,0x5f,1,2,
               (undefined1 *)((long)&local_140c._vptr_lazy_ostream + 4));
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::denorm_min();
    local_1470._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_1470._vptr_lazy_ostream = (_func_int **)0x8000000000000001;
    in_stack_ffffffffffffde68 = "0x8000000000000001";
    in_stack_ffffffffffffde60 = &local_1470;
    in_stack_ffffffffffffde58 = "TestDouble(-std::numeric_limits<double>::denorm_min())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
              (local_1450,local_1460,0x60,1,2,&local_1470.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::quiet_NaN();
    local_14d0._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_14d0._vptr_lazy_ostream = (_func_int **)0x7ff8000000000000;
    in_stack_ffffffffffffde68 = "0x7ff8000000000000";
    in_stack_ffffffffffffde60 = &local_14d0;
    in_stack_ffffffffffffde58 = "TestDouble(std::numeric_limits<double>::quiet_NaN())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_14b0,local_14c0,0x62,1,2,&local_14d0.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::quiet_NaN();
    local_1530._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_1530._vptr_lazy_ostream = (_func_int **)0x7ff8000000000000;
    in_stack_ffffffffffffde68 = "0x7ff8000000000000";
    in_stack_ffffffffffffde60 = &local_1530;
    in_stack_ffffffffffffde58 = "TestDouble(-std::numeric_limits<double>::quiet_NaN())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_1510,local_1520,99,1,2,&local_1530.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffde98,in_stack_ffffffffffffde90,in_stack_ffffffffffffde88,
               in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::signaling_NaN();
    local_1590._8_8_ = anon_unknown_4::TestDouble(f_00);
    local_1590._vptr_lazy_ostream = (_func_int **)0x7ff8000000000000;
    in_stack_ffffffffffffde68 = "0x7ff8000000000000";
    in_stack_ffffffffffffde60 = &local_1590;
    in_stack_ffffffffffffde58 = "TestDouble(std::numeric_limits<double>::signaling_NaN())";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_1570,local_1580,100,1,2,&local_1590.m_empty);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  do {
    file = &local_15a0;
    line_num = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    this_00 = local_15b0;
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde58);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (this_00,file,(size_t)line_num,in_stack_ffffffffffffde80);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffde60,(char (*) [1])in_stack_ffffffffffffde58);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffde68,
               (pointer)in_stack_ffffffffffffde60,(unsigned_long)in_stack_ffffffffffffde58);
    std::numeric_limits<double>::signaling_NaN();
    in_stack_ffffffffffffde80 = (const_string *)anon_unknown_4::TestDouble(f_00);
    local_15f0 = (undefined1  [8])0x7ff8000000000000;
    in_stack_ffffffffffffde68 = "0x7ff8000000000000";
    in_stack_ffffffffffffde60 = (lazy_ostream *)local_15f0;
    in_stack_ffffffffffffde58 = "TestDouble(-std::numeric_limits<double>::signaling_NaN())";
    local_15e8 = in_stack_ffffffffffffde80;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,long>
              (local_15d0,local_15e0,0x65,1,2,&local_15e8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffde58);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  for (j = 0; j < 1000; j = j + 1) {
    for (x = 0; x < 0x200; x = x + 1) {
      RandomMixin<FastRandomContext>::randbits(in_stack_ffffffffffffde78,in_stack_ffffffffffffde74);
      memcpy(local_2c,&DAT_01c67520,0x24);
      __begin3 = std::initializer_list<int>::begin
                           ((initializer_list<int> *)in_stack_ffffffffffffde58);
      piVar2 = std::initializer_list<int>::end((initializer_list<int> *)in_stack_ffffffffffffde68);
      for (; __begin3 != piVar2; __begin3 = __begin3 + 1) {
      }
      anon_unknown_4::TestDouble(f_00);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(double_serfloat_tests) {
    // Test specific values against their expected encoding.
    BOOST_CHECK_EQUAL(TestDouble(0.0), 0U);
    BOOST_CHECK_EQUAL(TestDouble(-0.0), 0x8000000000000000);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::infinity()), 0x7ff0000000000000U);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::infinity()), 0xfff0000000000000);
    BOOST_CHECK_EQUAL(TestDouble(0.5), 0x3fe0000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(1.0), 0x3ff0000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(2.0), 0x4000000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(4.0), 0x4010000000000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(785.066650390625), 0x4088888880000000ULL);
    BOOST_CHECK_EQUAL(TestDouble(3.7243058682384174), 0x400dcb60e0031440);
    BOOST_CHECK_EQUAL(TestDouble(91.64070592566159), 0x4056e901536d447a);
    BOOST_CHECK_EQUAL(TestDouble(-98.63087668642575), 0xc058a860489c007a);
    BOOST_CHECK_EQUAL(TestDouble(4.908737756962054), 0x4013a28c268b2b70);
    BOOST_CHECK_EQUAL(TestDouble(77.9247330021754), 0x40537b2ed3547804);
    BOOST_CHECK_EQUAL(TestDouble(40.24732825357566), 0x40441fa873c43dfc);
    BOOST_CHECK_EQUAL(TestDouble(71.39395607929222), 0x4051d936938f27b6);
    BOOST_CHECK_EQUAL(TestDouble(58.80100710817612), 0x404d668766a2bd70);
    BOOST_CHECK_EQUAL(TestDouble(-30.10665786964975), 0xc03e1b4dee1e01b8);
    BOOST_CHECK_EQUAL(TestDouble(60.15231509068704), 0x404e137f0f969814);
    BOOST_CHECK_EQUAL(TestDouble(-48.15848711335961), 0xc04814494e445bc6);
    BOOST_CHECK_EQUAL(TestDouble(26.68450101125353), 0x403aaf3b755169b0);
    BOOST_CHECK_EQUAL(TestDouble(-65.72071986604303), 0xc0506e2046378ede);
    BOOST_CHECK_EQUAL(TestDouble(17.95575825512381), 0x4031f4ac92b0a388);
    BOOST_CHECK_EQUAL(TestDouble(-35.27171863226279), 0xc041a2c7ad17a42a);
    BOOST_CHECK_EQUAL(TestDouble(-8.58810329425124), 0xc0212d1bdffef538);
    BOOST_CHECK_EQUAL(TestDouble(88.51393044338977), 0x405620e43c83b1c8);
    BOOST_CHECK_EQUAL(TestDouble(48.07224932612732), 0x4048093f77466ffc);
    BOOST_CHECK_EQUAL(TestDouble(9.867348871395659e+117), 0x586f4daeb2459b9f);
    BOOST_CHECK_EQUAL(TestDouble(-1.5166424385129721e+206), 0xeabe3bbc484bd458);
    BOOST_CHECK_EQUAL(TestDouble(-8.585156555624594e-275), 0x8707c76eee012429);
    BOOST_CHECK_EQUAL(TestDouble(2.2794371091628822e+113), 0x5777b2184458f4ee);
    BOOST_CHECK_EQUAL(TestDouble(-1.1290476594131867e+163), 0xe1c91893d3488bb0);
    BOOST_CHECK_EQUAL(TestDouble(9.143848423979275e-246), 0x0d0ff76e5f2620a3);
    BOOST_CHECK_EQUAL(TestDouble(-2.8366718125941117e+81), 0xd0d7ec7e754b394a);
    BOOST_CHECK_EQUAL(TestDouble(-1.2754409481684012e+229), 0xef80d32f8ec55342);
    BOOST_CHECK_EQUAL(TestDouble(6.000577060053642e-186), 0x197a1be7c8209b6a);
    BOOST_CHECK_EQUAL(TestDouble(2.0839423284378986e-302), 0x014c94f8689cb0a5);
    BOOST_CHECK_EQUAL(TestDouble(-1.422140051483753e+259), 0xf5bd99271d04bb35);
    BOOST_CHECK_EQUAL(TestDouble(-1.0593973991188853e+46), 0xc97db0cdb72d1046);
    BOOST_CHECK_EQUAL(TestDouble(2.62945125875249e+190), 0x67779b36366c993b);
    BOOST_CHECK_EQUAL(TestDouble(-2.920377657275094e+115), 0xd7e7b7b45908e23b);
    BOOST_CHECK_EQUAL(TestDouble(9.790289014855851e-118), 0x27a3c031cc428bcc);
    BOOST_CHECK_EQUAL(TestDouble(-4.629317182034961e-114), 0xa866ccf0b753705a);
    BOOST_CHECK_EQUAL(TestDouble(-1.7674605603846528e+279), 0xf9e8ed383ffc3e25);
    BOOST_CHECK_EQUAL(TestDouble(2.5308171727712605e+120), 0x58ef5cd55f0ec997);
    BOOST_CHECK_EQUAL(TestDouble(-1.05034156412799e+54), 0xcb25eea1b9350fa0);

    // Test extreme values
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::min()), 0x10000000000000);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::min()), 0x8010000000000000);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::max()), 0x7fefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::max()), 0xffefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::lowest()), 0xffefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::lowest()), 0x7fefffffffffffff);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::denorm_min()), 0x1);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::denorm_min()), 0x8000000000000001);
    // Note that all NaNs are encoded the same way.
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::quiet_NaN()), 0x7ff8000000000000);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::quiet_NaN()), 0x7ff8000000000000);
    BOOST_CHECK_EQUAL(TestDouble(std::numeric_limits<double>::signaling_NaN()), 0x7ff8000000000000);
    BOOST_CHECK_EQUAL(TestDouble(-std::numeric_limits<double>::signaling_NaN()), 0x7ff8000000000000);

    // Construct doubles to test from the encoding.
    static_assert(sizeof(double) == 8);
    static_assert(sizeof(uint64_t) == 8);
    for (int j = 0; j < 1000; ++j) {
        // Iterate over 9 specific bits exhaustively; the others are chosen randomly.
        // These specific bits are the sign bit, and the 2 top and bottom bits of
        // exponent and mantissa in the IEEE754 binary64 format.
        for (int x = 0; x < 512; ++x) {
            uint64_t v = m_rng.randbits(64);
            int x_pos = 0;
            for (int v_pos : {0, 1, 50, 51, 52, 53, 61, 62, 63}) {
                v &= ~(uint64_t{1} << v_pos);
                if ((x >> (x_pos++)) & 1) v |= (uint64_t{1} << v_pos);
            }
            double f;
            memcpy(&f, &v, 8);
            TestDouble(f);
        }
    }
}